

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationTorque.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorRotationTorque::ConstraintsFbLoadForces
          (ChLinkMotorRotationTorque *this,double factor)

{
  long *plVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ChBodyFrame *pCVar13;
  byte bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  undefined4 extraout_var;
  ulong *puVar28;
  undefined4 extraout_var_00;
  uint uVar29;
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  double dVar39;
  long in_XMM0_Qb;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  ChFrame<double> aframe2;
  ChFrame<double> aframe1;
  undefined1 local_1d8 [16];
  long alStack_1c8 [2];
  double dStack_1b8;
  long lStack_1b0;
  undefined1 auStack_1a8 [16];
  ChVectorRef local_190;
  undefined1 local_178 [16];
  double local_168;
  double dStack_160;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  ChFrame<double> local_120;
  ChFrame<double> local_98;
  
  auStack_1a8._8_8_ = auStack_1a8._0_8_;
  dVar39 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
           super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime;
  dStack_1b8 = factor;
  lStack_1b0 = in_XMM0_Qb;
  (*((this->super_ChLinkMotorRotation).super_ChLinkMotor.m_func.
     super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_ChFunction[4]
  )();
  auStack_1a8._0_8_ = dVar39;
  ChFrame<double>::operator>>
            (&local_98,
             &(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.frame1,
             (ChFrame<double> *)
             (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body1);
  ChFrame<double>::operator>>
            (&local_120,
             &(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.frame2,
             (ChFrame<double> *)
             (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body2);
  auVar40 = ZEXT816(0) << 0x40;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = auStack_1a8._0_8_;
  pCVar13 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
            super_ChLinkMate.super_ChLink.Body2;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_120.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       local_120.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] * 0.0;
  auVar2 = vfmadd231sd_fma(auVar45,auVar40,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_120.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       local_120.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] * 0.0;
  auVar3 = vfmadd231sd_fma(auVar47,auVar40,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_120.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  local_148 = vfmadd231sd_fma(auVar2,auVar48,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_120.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auStack_1a8 = vfmadd231sd_fma(auVar3,auVar48,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_120.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       local_120.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] * 0.0;
  auVar2 = vfmadd231sd_fma(auVar49,auVar40,auVar6);
  local_168 = local_148._0_8_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       local_168 *
       (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar3 = vfmadd231sd_fma(auVar41,auStack_1a8,auVar40);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_120.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  local_138 = vfmadd231sd_fma(auVar2,auVar48,auVar7);
  local_158._0_8_ = auStack_1a8._0_8_;
  local_158._8_8_ = local_158._0_8_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar3 = vfmadd231sd_fma(auVar3,local_138,auVar8);
  auVar46._0_8_ =
       local_168 *
       (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar46._8_8_ =
       local_168 *
       (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar2 = vfmadd231pd_fma(auVar46,local_158,
                           *(undefined1 (*) [16])
                            (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array);
  local_178._8_8_ = local_138._0_8_;
  local_178._0_8_ = local_138._0_8_;
  local_1d8 = vfmadd231pd_fma(auVar2,local_178,
                              *(undefined1 (*) [16])
                               ((pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix
                                .super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 6));
  alStack_1c8[0] = auVar3._0_8_;
  dStack_160 = local_168;
  iVar27 = (*(pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  ChVariables::Get_fb(&local_190,(ChVariables *)CONCAT44(extraout_var,iVar27));
  if ((long)local_190.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._8_8_ < 6) goto LAB_005b7b5c;
  uVar29 = 3;
  puVar28 = (ulong *)(local_190.
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                      ._0_8_ + 0x18);
  if (((ulong)puVar28 & 7) == 0) {
    uVar31 = -((uint)((ulong)puVar28 >> 3) & 0x1fffffff) & 7;
    if (uVar31 < 3) {
      uVar29 = uVar31;
    }
    if (uVar31 != 0) goto LAB_005b799a;
  }
  else {
LAB_005b799a:
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dStack_1b8;
    auVar34 = vbroadcastsd_avx512f(auVar9);
    auVar35 = vpbroadcastq_avx512f();
    uVar32 = vpcmpuq_avx512f(auVar35,_DAT_00968180,5);
    bVar14 = (byte)uVar32;
    auVar35._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * local_1d8._8_8_;
    auVar35._0_8_ = (ulong)(bVar14 & 1) * local_1d8._0_8_;
    auVar35._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * alStack_1c8[0];
    auVar35._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * alStack_1c8[1];
    auVar35._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * (long)dStack_1b8;
    auVar35._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * lStack_1b0;
    auVar35._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auStack_1a8._0_8_;
    auVar35._56_8_ = (uVar32 >> 7) * auStack_1a8._8_8_;
    auVar36._8_8_ =
         (ulong)((byte)(uVar32 >> 1) & 1) *
         *(long *)(local_190.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_ + 0x20);
    auVar36._0_8_ = (ulong)(bVar14 & 1) * *puVar28;
    auVar36._16_8_ =
         (ulong)((byte)(uVar32 >> 2) & 1) *
         *(long *)(local_190.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_ + 0x28);
    auVar36._24_8_ =
         (ulong)((byte)(uVar32 >> 3) & 1) *
         *(long *)(local_190.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_ + 0x30);
    auVar36._32_8_ =
         (ulong)((byte)(uVar32 >> 4) & 1) *
         *(long *)(local_190.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_ + 0x38);
    auVar36._40_8_ =
         (ulong)((byte)(uVar32 >> 5) & 1) *
         *(long *)(local_190.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_ + 0x40);
    auVar36._48_8_ =
         (ulong)((byte)(uVar32 >> 6) & 1) *
         *(long *)(local_190.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_ + 0x48);
    auVar36._56_8_ =
         (uVar32 >> 7) *
         *(long *)(local_190.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_ + 0x50);
    auVar34 = vmulpd_avx512f(auVar35,auVar34);
    auVar34 = vsubpd_avx512f(auVar36,auVar34);
    bVar15 = (bool)((byte)(uVar32 >> 1) & 1);
    bVar16 = (bool)((byte)(uVar32 >> 2) & 1);
    bVar17 = (bool)((byte)(uVar32 >> 3) & 1);
    bVar18 = (bool)((byte)(uVar32 >> 4) & 1);
    bVar19 = (bool)((byte)(uVar32 >> 5) & 1);
    bVar20 = (bool)((byte)(uVar32 >> 6) & 1);
    *puVar28 = (ulong)(bVar14 & 1) * auVar34._0_8_ | (ulong)!(bool)(bVar14 & 1) * *puVar28;
    *(ulong *)(local_190.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._0_8_ + 0x20) =
         (ulong)bVar15 * auVar34._8_8_ |
         (ulong)!bVar15 *
         *(long *)(local_190.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_ + 0x20);
    *(ulong *)(local_190.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._0_8_ + 0x28) =
         (ulong)bVar16 * auVar34._16_8_ |
         (ulong)!bVar16 *
         *(long *)(local_190.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_ + 0x28);
    *(ulong *)(local_190.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._0_8_ + 0x30) =
         (ulong)bVar17 * auVar34._24_8_ |
         (ulong)!bVar17 *
         *(long *)(local_190.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_ + 0x30);
    *(ulong *)(local_190.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._0_8_ + 0x38) =
         (ulong)bVar18 * auVar34._32_8_ |
         (ulong)!bVar18 *
         *(long *)(local_190.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_ + 0x38);
    *(ulong *)(local_190.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._0_8_ + 0x40) =
         (ulong)bVar19 * auVar34._40_8_ |
         (ulong)!bVar19 *
         *(long *)(local_190.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_ + 0x40);
    *(ulong *)(local_190.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._0_8_ + 0x48) =
         (ulong)bVar20 * auVar34._48_8_ |
         (ulong)!bVar20 *
         *(long *)(local_190.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_ + 0x48);
    *(ulong *)(local_190.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._0_8_ + 0x50) =
         (uVar32 >> 7) * auVar34._56_8_ |
         (ulong)!SUB81(uVar32 >> 7,0) *
         *(long *)(local_190.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_ + 0x50);
  }
  if (uVar29 < 3) {
    uVar30 = (ulong)(uVar29 << 3);
    auVar33 = vpbroadcastq_avx512vl();
    uVar32 = vpcmpuq_avx512vl(auVar33,_DAT_00955380,5);
    uVar32 = uVar32 & 0xf;
    bVar14 = (byte)uVar32;
    plVar1 = (long *)((long)puVar28 + uVar30);
    auVar33._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * plVar1[1];
    auVar33._0_8_ = (ulong)(bVar14 & 1) * *plVar1;
    auVar33._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * plVar1[2];
    auVar33._24_8_ = (uVar32 >> 3) * plVar1[3];
    auVar44._0_8_ = (double)((ulong)(bVar14 & 1) * *(long *)(local_1d8 + uVar30)) * dStack_1b8;
    auVar44._8_8_ =
         (double)((ulong)((byte)(uVar32 >> 1) & 1) * *(long *)(local_1d8 + uVar30 + 8)) * dStack_1b8
    ;
    auVar44._16_8_ =
         (double)((ulong)((byte)(uVar32 >> 2) & 1) * *(long *)((long)alStack_1c8 + uVar30)) *
         dStack_1b8;
    auVar44._24_8_ =
         (double)((uVar32 >> 3) * *(long *)((long)alStack_1c8 + uVar30 + 8)) * dStack_1b8;
    auVar33 = vsubpd_avx(auVar33,auVar44);
    puVar28 = (ulong *)((long)puVar28 + uVar30);
    bVar15 = (bool)((byte)(uVar32 >> 1) & 1);
    bVar16 = (bool)((byte)(uVar32 >> 2) & 1);
    *puVar28 = (ulong)(bVar14 & 1) * auVar33._0_8_ | (ulong)!(bool)(bVar14 & 1) * *puVar28;
    puVar28[1] = (ulong)bVar15 * auVar33._8_8_ | (ulong)!bVar15 * puVar28[1];
    puVar28[2] = (ulong)bVar16 * auVar33._16_8_ | (ulong)!bVar16 * puVar28[2];
    puVar28[3] = (uVar32 >> 3) * auVar33._24_8_ | (ulong)!SUB81(uVar32 >> 3,0) * puVar28[3];
  }
  pCVar13 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
            super_ChLinkMate.super_ChLink.Body1;
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       (double)local_148._0_8_ *
       (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar3 = vfmadd132sd_fma(auStack_1a8,auVar42,auVar10);
  auVar43._0_8_ =
       local_168 *
       (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar43._8_8_ =
       dStack_160 *
       (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar2 = vfmadd132pd_fma(local_158,auVar43,
                           *(undefined1 (*) [16])
                            (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar3 = vfmadd132sd_fma(local_138,auVar3,auVar11);
  local_1d8 = vfmadd132pd_fma(local_178,auVar2,
                              *(undefined1 (*) [16])
                               ((pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix
                                .super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 6));
  alStack_1c8[0] = auVar3._0_8_;
  iVar27 = (*(pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  ChVariables::Get_fb(&local_190,(ChVariables *)CONCAT44(extraout_var_00,iVar27));
  if ((long)local_190.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._8_8_ < 6) {
LAB_005b7b5c:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  uVar29 = 3;
  puVar28 = (ulong *)(local_190.
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                      ._0_8_ + 0x18);
  if (((ulong)puVar28 & 7) == 0) {
    uVar31 = -((uint)((ulong)puVar28 >> 3) & 0x1fffffff) & 7;
    if (uVar31 < 3) {
      uVar29 = uVar31;
    }
    if (uVar31 == 0) goto LAB_005b7b08;
  }
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dStack_1b8;
  auVar34 = vbroadcastsd_avx512f(auVar12);
  auVar35 = vpbroadcastq_avx512f();
  uVar32 = vpcmpuq_avx512f(auVar35,_DAT_00968180,5);
  bVar14 = (byte)uVar32;
  auVar37._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * local_1d8._8_8_;
  auVar37._0_8_ = (ulong)(bVar14 & 1) * local_1d8._0_8_;
  auVar37._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * alStack_1c8[0];
  auVar37._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * alStack_1c8[1];
  auVar37._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * (long)dStack_1b8;
  auVar37._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * lStack_1b0;
  auVar37._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auStack_1a8._0_8_;
  auVar37._56_8_ = (uVar32 >> 7) * auStack_1a8._8_8_;
  auVar38._8_8_ =
       (ulong)((byte)(uVar32 >> 1) & 1) *
       *(long *)(local_190.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x20);
  auVar38._0_8_ = (ulong)(bVar14 & 1) * *puVar28;
  auVar38._16_8_ =
       (ulong)((byte)(uVar32 >> 2) & 1) *
       *(long *)(local_190.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x28);
  auVar38._24_8_ =
       (ulong)((byte)(uVar32 >> 3) & 1) *
       *(long *)(local_190.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x30);
  auVar38._32_8_ =
       (ulong)((byte)(uVar32 >> 4) & 1) *
       *(long *)(local_190.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x38);
  auVar38._40_8_ =
       (ulong)((byte)(uVar32 >> 5) & 1) *
       *(long *)(local_190.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x40);
  auVar38._48_8_ =
       (ulong)((byte)(uVar32 >> 6) & 1) *
       *(long *)(local_190.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x48);
  auVar38._56_8_ =
       (uVar32 >> 7) *
       *(long *)(local_190.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x50);
  auVar34 = vmulpd_avx512f(auVar37,auVar34);
  auVar34 = vaddpd_avx512f(auVar34,auVar38);
  bVar15 = (bool)((byte)(uVar32 >> 1) & 1);
  bVar16 = (bool)((byte)(uVar32 >> 2) & 1);
  bVar17 = (bool)((byte)(uVar32 >> 3) & 1);
  bVar18 = (bool)((byte)(uVar32 >> 4) & 1);
  bVar19 = (bool)((byte)(uVar32 >> 5) & 1);
  bVar20 = (bool)((byte)(uVar32 >> 6) & 1);
  *puVar28 = (ulong)(bVar14 & 1) * auVar34._0_8_ | (ulong)!(bool)(bVar14 & 1) * *puVar28;
  *(ulong *)(local_190.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._0_8_ + 0x20) =
       (ulong)bVar15 * auVar34._8_8_ |
       (ulong)!bVar15 *
       *(long *)(local_190.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x20);
  *(ulong *)(local_190.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._0_8_ + 0x28) =
       (ulong)bVar16 * auVar34._16_8_ |
       (ulong)!bVar16 *
       *(long *)(local_190.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x28);
  *(ulong *)(local_190.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._0_8_ + 0x30) =
       (ulong)bVar17 * auVar34._24_8_ |
       (ulong)!bVar17 *
       *(long *)(local_190.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x30);
  *(ulong *)(local_190.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._0_8_ + 0x38) =
       (ulong)bVar18 * auVar34._32_8_ |
       (ulong)!bVar18 *
       *(long *)(local_190.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x38);
  *(ulong *)(local_190.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._0_8_ + 0x40) =
       (ulong)bVar19 * auVar34._40_8_ |
       (ulong)!bVar19 *
       *(long *)(local_190.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x40);
  *(ulong *)(local_190.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._0_8_ + 0x48) =
       (ulong)bVar20 * auVar34._48_8_ |
       (ulong)!bVar20 *
       *(long *)(local_190.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x48);
  *(ulong *)(local_190.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._0_8_ + 0x50) =
       (uVar32 >> 7) * auVar34._56_8_ |
       (ulong)!SUB81(uVar32 >> 7,0) *
       *(long *)(local_190.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x50);
LAB_005b7b08:
  if (uVar29 < 3) {
    uVar30 = (ulong)(uVar29 << 3);
    auVar33 = vpbroadcastq_avx512vl();
    uVar32 = vpcmpuq_avx512vl(auVar33,_DAT_00955380,5);
    uVar32 = uVar32 & 0xf;
    lVar21 = *(long *)(local_1d8 + uVar30 + 8);
    lVar22 = *(long *)((long)alStack_1c8 + uVar30);
    lVar23 = *(long *)((long)alStack_1c8 + uVar30 + 8);
    bVar14 = (byte)uVar32;
    plVar1 = (long *)((long)puVar28 + uVar30);
    lVar24 = plVar1[1];
    lVar25 = plVar1[2];
    lVar26 = plVar1[3];
    puVar28 = (ulong *)((long)puVar28 + uVar30);
    bVar15 = (bool)((byte)(uVar32 >> 1) & 1);
    bVar16 = (bool)((byte)(uVar32 >> 2) & 1);
    *puVar28 = (ulong)(bVar14 & 1) *
               (long)((double)((ulong)(bVar14 & 1) * *(long *)(local_1d8 + uVar30)) * dStack_1b8 +
                     (double)((ulong)(bVar14 & 1) * *plVar1)) |
               (ulong)!(bool)(bVar14 & 1) * *puVar28;
    puVar28[1] = (ulong)bVar15 *
                 (long)((double)((ulong)((byte)(uVar32 >> 1) & 1) * lVar21) * dStack_1b8 +
                       (double)((ulong)((byte)(uVar32 >> 1) & 1) * lVar24)) |
                 (ulong)!bVar15 * puVar28[1];
    puVar28[2] = (ulong)bVar16 *
                 (long)((double)((ulong)((byte)(uVar32 >> 2) & 1) * lVar22) * dStack_1b8 +
                       (double)((ulong)((byte)(uVar32 >> 2) & 1) * lVar25)) |
                 (ulong)!bVar16 * puVar28[2];
    puVar28[3] = (uVar32 >> 3) *
                 (long)((double)((uVar32 >> 3) * lVar23) * dStack_1b8 +
                       (double)((uVar32 >> 3) * lVar26)) | (ulong)!SUB81(uVar32 >> 3,0) * puVar28[3]
    ;
  }
  return;
}

Assistant:

void ChLinkMotorRotationTorque::ConstraintsFbLoadForces(double factor) {
    // compute instant torque
    double mT = m_func->Get_y(this->GetChTime());

    ChFrame<> aframe1 = this->frame1 >> (*this->Body1);
    ChFrame<> aframe2 = this->frame2 >> (*this->Body2);
    Vector m_abs_torque = aframe2.GetA() * ChVector<>(0, 0, mT);

    Body2->Variables().Get_fb().segment(3, 3) -= factor * Body2->TransformDirectionParentToLocal(m_abs_torque).eigen();
    Body1->Variables().Get_fb().segment(3, 3) += factor * Body1->TransformDirectionParentToLocal(m_abs_torque).eigen();
}